

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createVariable
          (Builder *this,Decoration precision,StorageClass storageClass,Id type,char *name,
          Id initializer,bool compilerGenerated)

{
  Function *pFVar1;
  Id IVar2;
  Id IVar3;
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  mapped_type_conflict *pmVar4;
  Instruction *raw_instruction;
  Id local_44;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  Decoration local_34;
  
  local_44 = type;
  local_34 = precision;
  IVar2 = makePointer(this,storageClass,type);
  this_00._M_head_impl = (Instruction *)operator_new(0x60);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  (this_00._M_head_impl)->resultId = IVar3;
  (this_00._M_head_impl)->typeId = IVar2;
  (this_00._M_head_impl)->opCode = OpVariable;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this_00._M_head_impl)->block = (Block *)0x0;
  Instruction::addImmediateOperand(this_00._M_head_impl,storageClass);
  if (initializer != 0) {
    Instruction::addIdOperand(this_00._M_head_impl,initializer);
  }
  local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)this_00._M_head_impl;
  if (storageClass == Function) {
    pFVar1 = this->buildPoint->parent;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&(*(pFVar1->blocks).
                     super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->localVariables,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    Module::mapInstruction(pFVar1->parent,this_00._M_head_impl);
    if (this->emitNonSemanticShaderDebugInfo == true && !compilerGenerated) {
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_44);
      IVar2 = createDebugLocalVariable(this,*pmVar4,name,0);
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
           (this_00._M_head_impl)->resultId;
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,(key_type_conflict *)&local_40);
      *pmVar4 = IVar2;
      makeDebugDeclare(this,IVar2,(this_00._M_head_impl)->resultId);
    }
  }
  else {
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if (local_40._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    Module::mapInstruction(&this->module,this_00._M_head_impl);
    if (this->emitNonSemanticShaderDebugInfo == true) {
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_44);
      IVar2 = createDebugGlobalVariable(this,*pmVar4,name,(this_00._M_head_impl)->resultId);
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
           (this_00._M_head_impl)->resultId;
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,(key_type_conflict *)&local_40);
      *pmVar4 = IVar2;
    }
  }
  if (name != (char *)0x0) {
    addName(this,(this_00._M_head_impl)->resultId,name);
  }
  IVar2 = (this_00._M_head_impl)->resultId;
  if (IVar2 != 0 && local_34 != DecorationMax) {
    addDecoration(this,IVar2,local_34,-1);
    IVar2 = (this_00._M_head_impl)->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::createVariable(Decoration precision, StorageClass storageClass, Id type, const char* name, Id initializer,
    bool const compilerGenerated)
{
    Id pointerType = makePointer(storageClass, type);
    Instruction* inst = new Instruction(getUniqueId(), pointerType, OpVariable);
    inst->addImmediateOperand(storageClass);
    if (initializer != NoResult)
        inst->addIdOperand(initializer);

    switch (storageClass) {
    case StorageClassFunction:
        // Validation rules require the declaration in the entry block
        buildPoint->getParent().addLocalVariable(std::unique_ptr<Instruction>(inst));

        if (emitNonSemanticShaderDebugInfo && !compilerGenerated)
        {
            auto const debugLocalVariableId = createDebugLocalVariable(debugId[type], name);
            debugId[inst->getResultId()] = debugLocalVariableId;

            makeDebugDeclare(debugLocalVariableId, inst->getResultId());
        }

        break;

    default:
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
        module.mapInstruction(inst);

        if (emitNonSemanticShaderDebugInfo)
        {
            auto const debugResultId = createDebugGlobalVariable(debugId[type], name, inst->getResultId());
            debugId[inst->getResultId()] = debugResultId;
        }
        break;
    }

    if (name)
        addName(inst->getResultId(), name);
    setPrecision(inst->getResultId(), precision);

    return inst->getResultId();
}